

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::RadioButton(char *label,bool active)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  undefined7 in_register_00000031;
  char *text;
  int idx;
  char cVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool held;
  bool hovered;
  float local_98;
  undefined4 local_94;
  ImVec2 local_90;
  float local_88;
  ImRect total_bb;
  float local_58;
  float fStack_54;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_94 = (undefined4)CONCAT71(in_register_00000031,active);
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_88 = GetFrameHeight();
    local_58 = IVar2.x;
    fStack_54 = IVar2.y;
    IVar2 = (this->DC).CursorPos;
    fVar10 = IVar2.x;
    fVar11 = IVar2.y;
    fVar9 = 0.0;
    if (0.0 < local_58) {
      fVar9 = (pIVar3->Style).ItemInnerSpacing.x + local_58;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    total_bb.Max.x = fVar9 + local_88 + fVar10;
    total_bb.Min = IVar2;
    total_bb.Max.y = text_baseline_y + text_baseline_y + fStack_54 + fVar11;
    ItemSize(&total_bb,text_baseline_y);
    bVar5 = false;
    bVar4 = ItemAdd(&total_bb,id,(ImRect *)0x0);
    if (bVar4) {
      fVar9 = local_88 + fVar10;
      local_90.y = (float)(int)((local_88 + fVar11 + fVar11) * 0.5 + 0.5);
      local_90.x = (float)(int)((fVar9 + fVar10) * 0.5 + 0.5);
      local_98 = (local_88 + -1.0) * 0.5;
      bVar5 = ButtonBehavior(&total_bb,id,&hovered,&held,0);
      if (bVar5) {
        MarkItemEdited(id);
      }
      RenderNavHighlight(&total_bb,id,1);
      iVar7 = ((held ^ 1U) & hovered) + 7;
      idx = 9;
      if ((hovered & 1U) == 0) {
        idx = iVar7;
      }
      pIVar1 = this->DrawList;
      if (held == false) {
        idx = iVar7;
      }
      IVar6 = GetColorU32(idx,1.0);
      ImDrawList::AddCircleFilled(pIVar1,&local_90,local_98,IVar6,0x10);
      cVar8 = (char)local_94;
      if (cVar8 != '\0') {
        fVar10 = 1.0;
        if (1.0 <= (float)(int)(local_88 / 6.0)) {
          fVar10 = (float)(int)(local_88 / 6.0);
        }
        pIVar1 = this->DrawList;
        local_88 = local_98 - fVar10;
        IVar6 = GetColorU32(0x12,1.0);
        ImDrawList::AddCircleFilled(pIVar1,&local_90,local_88,IVar6,0x10);
      }
      if (0.0 < (pIVar3->Style).FrameBorderSize) {
        pIVar1 = this->DrawList;
        local_38.y = local_90.y + 1.0;
        local_38.x = local_90.x + 1.0;
        IVar6 = GetColorU32(6,1.0);
        cVar8 = (char)local_94;
        ImDrawList::AddCircle(pIVar1,&local_38,local_98,IVar6,0x10,(pIVar3->Style).FrameBorderSize);
        pIVar1 = this->DrawList;
        IVar6 = GetColorU32(5,1.0);
        ImDrawList::AddCircle(pIVar1,&local_90,local_98,IVar6,0x10,(pIVar3->Style).FrameBorderSize);
      }
      if (pIVar3->LogEnabled == true) {
        text = "( )";
        if (cVar8 != '\0') {
          text = "(x)";
        }
        LogRenderedText(&total_bb.Min,text,(char *)0x0);
      }
      if (0.0 < local_58) {
        IVar2.y = (pIVar3->Style).FramePadding.y + fVar11;
        IVar2.x = (pIVar3->Style).ItemInnerSpacing.x + fVar9;
        RenderText(IVar2,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}